

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O1

int socket_wait(int fd,int is_read)

{
  int iVar1;
  fd_set *__writefds;
  fd_set *__readfds;
  timeval tv;
  fd_set fds;
  timeval local_98;
  fd_set local_88;
  
  local_98.tv_sec = 5;
  local_88.fds_bits[0] = 0;
  local_88.fds_bits[1] = 0;
  local_88.fds_bits[2] = 0;
  local_88.fds_bits[3] = 0;
  local_88.fds_bits[4] = 0;
  local_88.fds_bits[5] = 0;
  local_88.fds_bits[6] = 0;
  local_88.fds_bits[7] = 0;
  local_88.fds_bits[8] = 0;
  local_88.fds_bits[9] = 0;
  local_88.fds_bits[10] = 0;
  local_88.fds_bits[0xb] = 0;
  iVar1 = fd + 0x3f;
  if (-1 < fd) {
    iVar1 = fd;
  }
  local_88.fds_bits[0xc] = 0;
  local_88.fds_bits[0xd] = 0;
  local_88.fds_bits[0xe] = 0;
  local_88.fds_bits[0xf] = 0;
  local_88.fds_bits[iVar1 >> 6] = local_88.fds_bits[iVar1 >> 6] | 1L << ((byte)fd & 0x3f);
  __writefds = (fd_set *)0x0;
  if (is_read == 0) {
    __writefds = &local_88;
  }
  local_98.tv_usec = 0;
  __readfds = &local_88;
  if (is_read == 0) {
    __readfds = (fd_set *)0x0;
  }
  iVar1 = select(fd + 1,__readfds,__writefds,(fd_set *)0x0,&local_98);
  if (iVar1 == -1) {
    perror("select");
  }
  return iVar1;
}

Assistant:

static int socket_wait(int fd, int is_read)
{
	fd_set fds, *fdr = 0, *fdw = 0;
	struct timeval tv;
	int ret;
	tv.tv_sec = 5; tv.tv_usec = 0; // 5 seconds time out
	FD_ZERO(&fds);
	FD_SET(fd, &fds);
	if (is_read) fdr = &fds;
	else fdw = &fds;
	ret = select(fd+1, fdr, fdw, 0, &tv);
#ifndef _WIN32
	if (ret == -1) perror("select");
#else
	if (ret == 0)
		fprintf(stderr, "select time-out\n");
	else if (ret == SOCKET_ERROR)
		fprintf(stderr, "select: %d\n", WSAGetLastError());
#endif
	return ret;
}